

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::Login(Character *this)

{
  undefined8 uVar1;
  bool bVar2;
  iterator iVar3;
  __shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<char> local_69;
  undefined1 local_68 [32];
  shared_ptr<Quest_Context> context;
  Quest *quest;
  string local_30;
  
  CalculateStats(this,false);
  std::__cxx11::string::string((string *)&local_30,(string *)&this->quest_string);
  QuestUnserialize(&local_30,this);
  std::__cxx11::string::~string((string *)&local_30);
  (this->quest_string)._M_string_length = 0;
  *(this->quest_string)._M_dataplus._M_p = '\0';
  GetQuest((Character *)local_68,(short)this);
  uVar1 = local_68._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  if ((Character *)uVar1 == (Character *)0x0) {
    local_68._0_8_ = local_68._0_8_ & 0xffffffffffff0000;
    iVar3 = std::
            _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
            ::find(&(this->world->quests)._M_t,(key_type *)local_68);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->world->quests)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = Quest::Disabled((Quest *)iVar3._M_node[1]._M_parent);
      if (!bVar2) {
        local_68._0_8_ = this;
        std::make_shared<Quest_Context,Character*,Quest*&>
                  ((Character **)&context,(Quest **)local_68);
        this_00 = &std::
                   map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                   ::operator[](&this->quests,(key_type *)(iVar3._M_node + 1))->
                   super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"begin",&local_69);
        EOPlus::Context::SetState
                  (&(context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_Context,(string *)local_68,true);
        std::__cxx11::string::~string((string *)local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
  }
  this->online = true;
  CalculateStats(this,true);
  return;
}

Assistant:

void Character::Login()
{
	this->CalculateStats(false);

	QuestUnserialize(this->quest_string, this);
	this->quest_string.clear();

	// Start the default 00000.eqf quest
	if (!this->GetQuest(0))
	{
		auto it = this->world->quests.find(0);

		if (it != this->world->quests.end())
		{
			// WARNING: holds a non-tracked reference to shared_ptr
			Quest* quest = it->second.get();

			if (!quest->Disabled())
			{
				auto context = std::make_shared<Quest_Context>(this, quest);
				this->quests[it->first] = context;
				context->SetState("begin");
			}
		}
	}

	this->online = true;

	this->CalculateStats();
}